

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O3

void __thiscall
de::ArrayBuffer<unsigned_char,_4UL,_1UL>::ArrayBuffer
          (ArrayBuffer<unsigned_char,_4UL,_1UL> *this,size_t numElements)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  this->m_ptr = (void *)0x0;
  this->m_cap = 0;
  if (numElements != 0) {
    pvVar1 = detail::ArrayBuffer_AlignedMalloc(numElements,4);
    if (pvVar1 == (void *)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = glViewport;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    this->m_ptr = pvVar1;
    this->m_cap = numElements;
  }
  return;
}

Assistant:

ArrayBuffer<T,Alignment,Stride>::ArrayBuffer (size_t numElements)
	: m_ptr	(DE_NULL)
	, m_cap	(0)
{
	if (numElements)
	{
		// \note no need to allocate stride for the last element, sizeof(T) is enough. Also handles cases where sizeof(T) > Stride
		const size_t	storageSize	= (numElements - 1) * Stride + sizeof(T);
		void* const		ptr			= detail::ArrayBuffer_AlignedMalloc(storageSize, Alignment);

		if (!ptr)
			throw std::bad_alloc();

		m_ptr = ptr;
		m_cap = numElements;
	}
}